

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-and-bound-solver.hpp
# Opt level: O3

int __thiscall
baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,double>::operator()
          (branch_and_bound_solver<baryonyx::itm::maximize_tag,double> *this,
          vector<rc,_std::allocator<rc>_> *reduced_cost,int r_size,int bk_min,int bk_max)

{
  pointer prVar1;
  byte bVar2;
  int iVar3;
  size_type sVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  solver_failure *this_00;
  int iVar9;
  long lVar10;
  long unaff_RBP;
  long lVar11;
  ulong uVar12;
  int *piVar13;
  uint *puVar14;
  long lVar15;
  __normal_iterator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::item_*,_std::vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::item>_>_>
  __i;
  ulong uVar16;
  long lVar17;
  bool bVar18;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar19 [32];
  
  if (bk_min < r_size) {
LAB_00106853:
    operator()();
  }
  else {
    *(int *)(this + 100) = r_size;
    *(int *)(this + 0x68) = bk_min;
    std::
    vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::item>_>
    ::resize((vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::item>_>
              *)(this + 0x20),4);
    iVar3 = shared_subvector::init((shared_subvector *)this,(EVP_PKEY_CTX *)0x4);
    if ((char)iVar3 == '\0') goto LAB_0010685d;
    sVar4 = shared_subvector::emplace((shared_subvector *)this);
    *(size_type *)(this + 0x60) = sVar4;
    if (sVar4 == 0) {
      if (*(long *)(this + 0x40) != *(long *)(this + 0x38)) {
        *(long *)(this + 0x40) = *(long *)(this + 0x38);
      }
      prVar1 = (reduced_cost->super__Vector_base<rc,_std::allocator<rc>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar17 = *(long *)(this + 0x20);
      lVar10 = 0;
      do {
        *(undefined8 *)(lVar17 + lVar10 * 2) = *(undefined8 *)((long)&prVar1->value + lVar10);
        *(undefined4 *)(lVar17 + 0x18 + lVar10 * 2) = *(undefined4 *)((long)&prVar1->id + lVar10);
        iVar3 = *(int *)((long)&prVar1->f + lVar10);
        *(int *)(lVar17 + 0x14 + lVar10 * 2) = iVar3;
        iVar9 = -iVar3;
        if (0 < iVar3) {
          iVar9 = iVar3;
        }
        *(int *)(lVar17 + 0x10 + lVar10 * 2) = iVar9;
        *(undefined4 *)(lVar17 + 0x1c + lVar10 * 2) = 0;
        lVar10 = lVar10 + 0x10;
      } while (lVar10 != 0x40);
      shared_subvector::check_index((shared_subvector *)this,0);
      if ((ulong)*(uint *)(this + 0x18) != 0) {
        memset(*(void **)this,0,(ulong)*(uint *)(this + 0x18));
      }
      lVar17 = *(long *)(this + 0x20);
      lVar10 = *(long *)(this + 0x28);
      if (lVar17 != lVar10) {
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,double>::item*,std::vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,double>::item,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,double>::item>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (lVar17,lVar10,(int)LZCOUNT(lVar10 - lVar17 >> 5) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,double>::item*,std::vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,double>::item,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,double>::item>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (lVar17,lVar10);
        lVar17 = *(long *)(this + 0x20);
        lVar10 = *(long *)(this + 0x28);
      }
      iVar3 = *(int *)(this + 100);
      iVar9 = *(int *)(this + 0x68);
      if (lVar10 - lVar17 != 0) {
        lVar11 = lVar10 - lVar17 >> 5;
        piVar13 = (int *)(lVar17 + 0x14);
        do {
          if (*piVar13 < 0) {
            iVar3 = iVar3 + piVar13[-1];
            iVar9 = iVar9 + piVar13[-1];
            *(int *)(this + 100) = iVar3;
            *(int *)(this + 0x68) = iVar9;
          }
          piVar13 = piVar13 + 8;
          lVar11 = lVar11 + -1;
        } while (lVar11 != 0);
      }
      *(undefined8 *)(lVar10 + -0x18) = *(undefined8 *)(lVar10 + -0x20);
      iVar5 = (int)((ulong)(lVar10 - lVar17) >> 5);
      if (1 < iVar5) {
        lVar10 = (ulong)(iVar5 - 2) << 5;
        do {
          *(double *)(lVar17 + 8 + lVar10) =
               *(double *)(lVar17 + 0x28 + lVar10) + *(double *)(lVar17 + lVar10);
          lVar10 = lVar10 + -0x20;
        } while (lVar10 != -0x20);
      }
      if (iVar9 == iVar3) {
        branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::solve_equality
                  ((branch_and_bound_solver<baryonyx::itm::maximize_tag,_double> *)this);
      }
      else {
        branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::solve_inequality
                  ((branch_and_bound_solver<baryonyx::itm::maximize_tag,_double> *)this);
      }
      lVar17 = *(long *)(this + 0x28);
      lVar10 = *(long *)(this + 0x20);
      uVar16 = lVar17 - lVar10;
      if ((int)(uVar16 >> 5) != 0) {
        lVar11 = *(long *)this;
        lVar8 = *(long *)(this + 8);
        uVar6 = *(uint *)(this + 0x60);
        puVar14 = (uint *)(lVar10 + 0x1c);
        uVar12 = uVar16 >> 5 & 0xffffffff;
        do {
          uVar7 = (ulong)uVar6;
          if ((int)puVar14[-2] < 1) {
            if ((ulong)(lVar8 - lVar11) <= uVar7) goto LAB_0010684e;
            bVar18 = *(char *)(lVar11 + uVar7) == '\0';
          }
          else {
            if ((ulong)(lVar8 - lVar11) <= uVar7) {
              operator()();
LAB_0010684e:
              operator()();
              goto LAB_00106853;
            }
            bVar18 = *(char *)(lVar11 + uVar7) != '\0';
          }
          uVar6 = uVar6 + 1;
          *puVar14 = (uint)bVar18;
          puVar14 = puVar14 + 8;
          uVar12 = uVar12 - 1;
        } while (uVar12 != 0);
      }
      if (lVar10 != lVar17) {
        std::operator()(lVar10,lVar17,(int)LZCOUNT((long)uVar16 >> 5) * 2 ^ 0x7e);
        if ((long)uVar16 < 0x201) {
          std::operator()(lVar10,lVar17);
        }
        else {
          lVar11 = lVar10 + 0x200;
          std::operator()(lVar10,lVar11);
          for (; lVar11 != lVar17; lVar11 = lVar11 + 0x20) {
            std::operator()(lVar11);
          }
        }
      }
      lVar17 = *(long *)(this + 0x20);
      lVar10 = *(long *)(this + 0x28);
      uVar12 = lVar10 - lVar17;
      lVar11 = lVar17;
      uVar16 = uVar12;
      if (0 < (long)uVar12 >> 7) {
        lVar15 = ((long)uVar12 >> 7) + 1;
        lVar8 = lVar17 + 0x40;
        lVar11 = (uVar12 & 0xffffffffffffff80) + lVar17;
        do {
          if (*(int *)(lVar8 + -0x24) == 0) {
            lVar8 = lVar8 + -0x40;
            goto LAB_00106752;
          }
          if (*(int *)(lVar8 + -4) == 0) {
            lVar8 = lVar8 + -0x20;
            goto LAB_00106752;
          }
          if (*(int *)(lVar8 + 0x1c) == 0) goto LAB_00106752;
          if (*(int *)(lVar8 + 0x3c) == 0) {
            lVar8 = lVar8 + 0x20;
            goto LAB_00106752;
          }
          lVar15 = lVar15 + -1;
          lVar8 = lVar8 + 0x80;
        } while (1 < lVar15);
        uVar16 = lVar10 - lVar11;
      }
      lVar15 = (long)uVar16 >> 5;
      if (lVar15 != 1) {
        if (lVar15 != 2) {
          lVar8 = lVar10;
          if ((lVar15 != 3) || (lVar8 = lVar11, *(int *)(lVar11 + 0x1c) == 0)) goto LAB_00106752;
          lVar11 = lVar11 + 0x20;
        }
        lVar8 = lVar11;
        if (*(int *)(lVar11 + 0x1c) == 0) goto LAB_00106752;
        lVar11 = lVar11 + 0x20;
      }
      lVar8 = lVar11;
      if (*(int *)(lVar11 + 0x1c) != 0) {
        lVar8 = lVar10;
      }
LAB_00106752:
      if (uVar12 != 0) {
        auVar22 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar23 = vpbroadcastq_avx512f(ZEXT816(8));
        lVar11 = (long)uVar12 >> 5;
        auVar24 = vpbroadcastq_avx512f();
        uVar16 = lVar11 + 7U & 0xfffffffffffffff8;
        auVar25 = vpbroadcastq_avx512f();
        auVar26 = vpbroadcastq_avx512f();
        do {
          uVar12 = vpcmpuq_avx512f(auVar22,auVar25,2);
          auVar27 = vpsllq_avx512f(auVar22,5);
          uVar16 = uVar16 - 8;
          vpaddq_avx512f(auVar24,auVar27);
          auVar27 = vgatherqpd_avx512f(*(undefined8 *)(lVar17 + unaff_RBP));
          bVar2 = (byte)uVar12;
          auVar28._8_8_ = (ulong)((byte)(uVar12 >> 1) & 1) * auVar27._8_8_;
          auVar28._0_8_ = (ulong)(bVar2 & 1) * auVar27._0_8_;
          auVar28._16_8_ = (ulong)((byte)(uVar12 >> 2) & 1) * auVar27._16_8_;
          auVar28._24_8_ = (ulong)((byte)(uVar12 >> 3) & 1) * auVar27._24_8_;
          auVar28._32_8_ = (ulong)((byte)(uVar12 >> 4) & 1) * auVar27._32_8_;
          auVar28._40_8_ = (ulong)((byte)(uVar12 >> 5) & 1) * auVar27._40_8_;
          auVar28._48_8_ = (ulong)((byte)(uVar12 >> 6) & 1) * auVar27._48_8_;
          auVar28._56_8_ = (uVar12 >> 7) * auVar27._56_8_;
          auVar27 = vpsllq_avx512f(auVar22,4);
          auVar22 = vpaddq_avx512f(auVar22,auVar23);
          auVar29 = vpaddq_avx512f(auVar26,auVar27);
          vscatterqpd_avx512f(ZEXT864((reduced_cost->super__Vector_base<rc,_std::allocator<rc>_>).
                                      _M_impl.super__Vector_impl_data._M_start) + auVar27,uVar12,
                              auVar28);
          auVar19 = vpgatherqd_avx512f(*(undefined8 *)(lVar11 + 0x17));
          auVar20._4_4_ = (uint)((byte)(uVar12 >> 1) & 1) * auVar19._4_4_;
          auVar20._0_4_ = (uint)(bVar2 & 1) * auVar19._0_4_;
          auVar20._8_4_ = (uint)((byte)(uVar12 >> 2) & 1) * auVar19._8_4_;
          auVar20._12_4_ = (uint)((byte)(uVar12 >> 3) & 1) * auVar19._12_4_;
          auVar20._16_4_ = (uint)((byte)(uVar12 >> 4) & 1) * auVar19._16_4_;
          auVar20._20_4_ = (uint)((byte)(uVar12 >> 5) & 1) * auVar19._20_4_;
          auVar20._24_4_ = (uint)((byte)(uVar12 >> 6) & 1) * auVar19._24_4_;
          auVar20._28_4_ = (uint)(byte)(uVar12 >> 7) * auVar19._28_4_;
          vpscatterqd_avx512f(ZEXT832(8) + auVar29._0_32_,uVar12,auVar20);
          auVar19 = vpgatherqd_avx512f(*(undefined8 *)(lVar11 + 0x13));
          auVar21._4_4_ = (uint)((byte)(uVar12 >> 1) & 1) * auVar19._4_4_;
          auVar21._0_4_ = (uint)(bVar2 & 1) * auVar19._0_4_;
          auVar21._8_4_ = (uint)((byte)(uVar12 >> 2) & 1) * auVar19._8_4_;
          auVar21._12_4_ = (uint)((byte)(uVar12 >> 3) & 1) * auVar19._12_4_;
          auVar21._16_4_ = (uint)((byte)(uVar12 >> 4) & 1) * auVar19._16_4_;
          auVar21._20_4_ = (uint)((byte)(uVar12 >> 5) & 1) * auVar19._20_4_;
          auVar21._24_4_ = (uint)((byte)(uVar12 >> 6) & 1) * auVar19._24_4_;
          auVar21._28_4_ = (uint)(byte)(uVar12 >> 7) * auVar19._28_4_;
          vpscatterqd_avx512f(ZEXT832(0xc) + auVar29._0_32_,uVar12,auVar21);
        } while (uVar16 != 0);
      }
      if (lVar8 == lVar10) {
        uVar6 = -(uint)(*(int *)(lVar17 + 0x1c) == 0) | 4;
      }
      else {
        uVar6 = (int)((ulong)(lVar8 - lVar17) >> 5) - 1;
      }
      return uVar6;
    }
  }
  operator()();
LAB_0010685d:
  this_00 = (solver_failure *)__cxa_allocate_exception(0x18);
  solver_failure::solver_failure(this_00,no_solver_available);
  __cxa_throw(this_00,&solver_failure::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int solve(R& reduced_cost, int r_size, int bk_min, int bk_max)
    {
        bx_assert(r_size >= 4);
        bx_assert(bk_min <= bk_max);

        b_min = bk_min;
        b_max = bk_max;

        items.resize(r_size);
        if (!subvector.init(r_size))
            throw solver_failure(solver_error_tag::no_solver_available);

        solution = subvector.emplace();

        bx_assert(solution == 0u);

        nodes.clear();

        for (int i = 0; i != r_size; ++i) {
            items[i].r = reduced_cost[i].value;
            items[i].variable = reduced_cost[i].id;
            items[i].original_factor = reduced_cost[i].f;
            items[i].factor = std::abs(reduced_cost[i].f);
            items[i].result = 0;
        }

        std::fill_n(
          subvector.element_data(solution), subvector.element_size(), 0);

        std::sort(std::begin(items), std::end(items));

        for (std::size_t i = 0, e = items.size(); i != e; ++i) {
            if (items[i].original_factor < 0) {
                b_min += items[i].factor;
                b_max += items[i].factor;
            }
        }

        // Compute the inversion of the sum z
        items.back().sum_z = items.back().r;
        for (int i = length(items) - 2; i >= 0; --i)
            items[i].sum_z = items[i + 1].sum_z + items[i].r;

        if (b_max == b_min)
            solve_equality();
        else
            solve_inequality();

        for (int i = 0, e = length(items); i != e; ++i) {
            if (items[i].original_factor > 0)
                items[i].result = subvector[solution + i] == 0 ? 0 : 1;
            else
                items[i].result = subvector[solution + i] == 0 ? 1 : 0;
        }

        std::sort(std::begin(items),
                  std::end(items),
                  [](const auto& lhs, const auto& rhs) {
                      if (lhs.result == rhs.result) {
                          if constexpr (std::is_same_v<Mode, minimize_tag>)
                              return lhs.r < rhs.r;
                          else
                              return lhs.r > rhs.r;
                      } else
                          return lhs.result > rhs.result;
                  });

        auto middle =
          std::find_if(std::begin(items),
                       std::end(items),
                       [](const auto& item) { return item.result == 0; });

        for (std::size_t i = 0, e = items.size(); i != e; ++i) {
            reduced_cost[i].value = items[i].r;
            reduced_cost[i].id = items[i].variable;
            reduced_cost[i].f = items[i].original_factor;
        }

        if (middle == std::end(items))
            return items[0].result == 0 ? -1 : r_size;

        return static_cast<int>(std::distance(std::begin(items), middle) - 1);
    }